

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

OPJ_BOOL opj_mct_decode_custom
                   (OPJ_BYTE *pDecodingData,OPJ_SIZE_T n,OPJ_BYTE **pData,OPJ_UINT32 pNbComp,
                   OPJ_UINT32 isSigned)

{
  undefined4 uVar1;
  OPJ_BYTE *pOVar2;
  void *ptr;
  OPJ_FLOAT32 **lData;
  OPJ_FLOAT32 *lCurrentResult;
  OPJ_FLOAT32 *lCurrentData;
  OPJ_UINT32 k;
  OPJ_UINT32 j;
  OPJ_SIZE_T i;
  OPJ_FLOAT32 *lMct;
  OPJ_UINT32 isSigned_local;
  OPJ_UINT32 pNbComp_local;
  OPJ_BYTE **pData_local;
  OPJ_SIZE_T n_local;
  OPJ_BYTE *pDecodingData_local;
  
  ptr = opj_malloc((ulong)(pNbComp << 1) << 2);
  if (ptr == (void *)0x0) {
    pDecodingData_local._4_4_ = 0;
  }
  else {
    for (_k = 0; _k < n; _k = _k + 1) {
      for (lCurrentData._4_4_ = 0; lCurrentData._4_4_ < pNbComp;
          lCurrentData._4_4_ = lCurrentData._4_4_ + 1) {
        *(undefined4 *)((long)ptr + (ulong)lCurrentData._4_4_ * 4) =
             *(undefined4 *)pData[lCurrentData._4_4_];
      }
      i = (OPJ_SIZE_T)pDecodingData;
      for (lCurrentData._4_4_ = 0; lCurrentData._4_4_ < pNbComp;
          lCurrentData._4_4_ = lCurrentData._4_4_ + 1) {
        *(undefined4 *)((long)ptr + (ulong)lCurrentData._4_4_ * 4 + (ulong)pNbComp * 4) = 0;
        for (lCurrentData._0_4_ = 0; (uint)lCurrentData < pNbComp;
            lCurrentData._0_4_ = (uint)lCurrentData + 1) {
          *(float *)((long)ptr + (ulong)lCurrentData._4_4_ * 4 + (ulong)pNbComp * 4) =
               *(float *)i * *(float *)((long)ptr + (ulong)(uint)lCurrentData * 4) +
               *(float *)((long)ptr + (ulong)lCurrentData._4_4_ * 4 + (ulong)pNbComp * 4);
          i = i + 4;
        }
        uVar1 = *(undefined4 *)((long)ptr + (ulong)lCurrentData._4_4_ * 4 + (ulong)pNbComp * 4);
        pOVar2 = pData[lCurrentData._4_4_];
        pData[lCurrentData._4_4_] = pOVar2 + 4;
        *(undefined4 *)pOVar2 = uVar1;
      }
    }
    opj_free(ptr);
    pDecodingData_local._4_4_ = 1;
  }
  return pDecodingData_local._4_4_;
}

Assistant:

OPJ_BOOL opj_mct_decode_custom(
    OPJ_BYTE * pDecodingData,
    OPJ_SIZE_T n,
    OPJ_BYTE ** pData,
    OPJ_UINT32 pNbComp,
    OPJ_UINT32 isSigned)
{
    OPJ_FLOAT32 * lMct;
    OPJ_SIZE_T i;
    OPJ_UINT32 j;
    OPJ_UINT32 k;

    OPJ_FLOAT32 * lCurrentData = 00;
    OPJ_FLOAT32 * lCurrentResult = 00;
    OPJ_FLOAT32 ** lData = (OPJ_FLOAT32 **) pData;

    OPJ_ARG_NOT_USED(isSigned);

    lCurrentData = (OPJ_FLOAT32 *) opj_malloc(2 * pNbComp * sizeof(OPJ_FLOAT32));
    if (! lCurrentData) {
        return OPJ_FALSE;
    }
    lCurrentResult = lCurrentData + pNbComp;

    for (i = 0; i < n; ++i) {
        lMct = (OPJ_FLOAT32 *) pDecodingData;
        for (j = 0; j < pNbComp; ++j) {
            lCurrentData[j] = (OPJ_FLOAT32)(*(lData[j]));
        }
        for (j = 0; j < pNbComp; ++j) {
            lCurrentResult[j] = 0;
            for (k = 0; k < pNbComp; ++k) {
                lCurrentResult[j] += *(lMct++) * lCurrentData[k];
            }
            *(lData[j]++) = (OPJ_FLOAT32)(lCurrentResult[j]);
        }
    }
    opj_free(lCurrentData);
    return OPJ_TRUE;
}